

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O1

bool Omega_h::inertia::anon_unknown_0::mark_axis_bisection
               (CommPtr *comm,Reals *distances,Reals *masses,Real total_mass,Real tolerance,
               Read<signed_char> *marked)

{
  int *piVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  IntIterator last;
  int iVar8;
  size_t sVar9;
  Alloc *pAVar10;
  Alloc *this_00;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar14;
  double dVar15;
  ulong in_XMM1_Qb;
  MinMax<double> MVar16;
  type f;
  Write<double> weighted;
  Write<signed_char> marked_1;
  type f_1;
  bool local_191;
  undefined1 local_190 [32];
  Alloc *local_170;
  void *local_168;
  Real local_160;
  Write<double> local_158;
  Write<signed_char> local_148;
  Alloc *local_138;
  void *pvStack_130;
  Alloc *local_128;
  void *pvStack_120;
  undefined1 local_118 [16];
  Reals *local_100;
  Alloc *local_f8;
  void *local_f0;
  Alloc *local_e8;
  void *local_e0;
  Alloc *local_d8;
  void *local_d0;
  Write<signed_char> local_c8;
  Alloc *local_b8;
  void *local_b0;
  Alloc *local_a8;
  void *local_a0;
  CommPtr *local_98;
  Real local_90;
  Write<double> local_88;
  double local_78;
  ulong uStack_70;
  Read<double> local_68;
  CommPtr local_58;
  Reals *local_48;
  Read<signed_char> *local_40;
  Real local_38;
  
  pAVar10 = (distances->write_).shared_alloc_.alloc;
  if (((ulong)pAVar10 & 1) == 0) {
    uVar4 = pAVar10->size;
  }
  else {
    uVar4 = (ulong)pAVar10 >> 3;
  }
  pAVar10 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)pAVar10 & 1) == 0) {
    uVar5 = pAVar10->size;
  }
  else {
    uVar5 = (ulong)pAVar10 >> 3;
  }
  local_100 = masses;
  local_98 = comm;
  local_90 = tolerance;
  if ((int)(uVar4 >> 3) == (int)(uVar5 >> 3)) {
    local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_68.write_.shared_alloc_.alloc = (distances->write_).shared_alloc_.alloc;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.write_.shared_alloc_.alloc)->use_count =
             (local_68.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.write_.shared_alloc_.direct_ptr = (distances->write_).shared_alloc_.direct_ptr;
    local_160 = total_mass;
    MVar16 = get_minmax<double>(&local_58,&local_68);
    pAVar10 = local_68.write_.shared_alloc_.alloc;
    local_78 = MVar16.max;
    uVar11 = MVar16.min._0_4_;
    uVar12 = MVar16.min._4_4_;
    uVar13 = extraout_XMM0_Dc;
    uVar14 = extraout_XMM0_Dd;
    uStack_70 = in_XMM1_Qb;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      uVar13 = extraout_XMM0_Dc;
      uVar14 = extraout_XMM0_Dd;
      if (*piVar1 == 0) {
        local_118._8_4_ = extraout_XMM0_Dc;
        local_118._0_8_ = MVar16.min;
        local_118._12_4_ = extraout_XMM0_Dd;
        Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
        operator_delete(pAVar10,0x48);
        uVar11 = local_118._0_4_;
        uVar12 = local_118._4_4_;
        uVar13 = local_118._8_4_;
        uVar14 = local_118._12_4_;
      }
    }
    if (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_118._4_4_ = uVar12;
      local_118._0_4_ = uVar11;
      local_118._8_4_ = uVar13;
      local_118._12_4_ = uVar14;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      uVar11 = local_118._0_4_;
      uVar12 = local_118._4_4_;
    }
    local_78 = ABS(local_78);
    uStack_70 = uStack_70 & 0x7fffffffffffffff;
    if (local_78 <= ABS((double)CONCAT44(uVar12,uVar11))) {
      local_78 = ABS((double)CONCAT44(uVar12,uVar11));
    }
    local_160 = local_160 * 0.5;
    dVar15 = 0.0;
    uVar7 = 0;
    local_191 = true;
    local_48 = distances;
    local_40 = marked;
    while( true ) {
      local_78 = local_78 * 0.5;
      local_e8 = (local_48->write_).shared_alloc_.alloc;
      if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_e8 = (Alloc *)(local_e8->size * 8 + 1);
        }
        else {
          local_e8->use_count = local_e8->use_count + 1;
        }
      }
      local_e0 = (local_48->write_).shared_alloc_.direct_ptr;
      local_118._0_8_ = dVar15;
      if (((ulong)local_e8 & 1) == 0) {
        sVar9 = local_e8->size;
      }
      else {
        sVar9 = (ulong)local_e8 >> 3;
      }
      local_190._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_190._16_8_ = local_190._16_8_ & 0xffffffffffffff00;
      iVar8 = (int)(sVar9 >> 3);
      local_190._0_8_ = local_190 + 0x10;
      Write<signed_char>::Write(&local_148,iVar8,(string *)local_190);
      if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
        operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
      }
      local_190._0_8_ = local_148.shared_alloc_.alloc;
      if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
          local_148.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_190._0_8_ = (local_148.shared_alloc_.alloc)->size * 8 + 1;
        }
        else {
          (local_148.shared_alloc_.alloc)->use_count =
               (local_148.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_190._8_8_ = local_148.shared_alloc_.direct_ptr;
      local_190._16_8_ = local_e8;
      if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_190._16_8_ = local_e8->size * 8 + 1;
        }
        else {
          local_e8->use_count = local_e8->use_count + 1;
        }
      }
      local_190._24_8_ = local_e0;
      local_170 = (Alloc *)local_118._0_8_;
      pAVar10 = (Alloc *)local_190._0_8_;
      if ((local_190._0_8_ & 7) == 0 && (Alloc *)local_190._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          pAVar10 = (Alloc *)(*(long *)local_190._0_8_ * 8 + 1);
        }
        else {
          *(int *)(local_190._0_8_ + 0x30) = *(int *)(local_190._0_8_ + 0x30) + 1;
        }
      }
      this_00 = (Alloc *)local_190._16_8_;
      if ((local_190._16_8_ & 7) == 0 && (Alloc *)local_190._16_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          this_00 = (Alloc *)(*(long *)local_190._16_8_ * 8 + 1);
        }
        else {
          *(int *)(local_190._16_8_ + 0x30) = *(int *)(local_190._16_8_ + 0x30) + 1;
        }
      }
      if (0 < iVar8) {
        if (((ulong)pAVar10 & 7) == 0 && pAVar10 != (Alloc *)0x0) {
          pAVar10->use_count = pAVar10->use_count + -1;
          pAVar10 = (Alloc *)(pAVar10->size * 8 + 1);
        }
        if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
          this_00->use_count = this_00->use_count + -1;
          this_00 = (Alloc *)(this_00->size * 8 + 1);
        }
        entering_parallel = '\0';
        lVar6 = 0;
        do {
          *(bool *)((long)(_func_int ***)local_148.shared_alloc_.direct_ptr + lVar6) =
               (double)local_118._0_8_ < *(double *)((long)local_e0 + lVar6 * 8);
          lVar6 = lVar6 + 1;
        } while (iVar8 != (int)lVar6);
        if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
          piVar1 = &this_00->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(this_00);
            operator_delete(this_00,0x48);
          }
        }
        if (((ulong)pAVar10 & 7) == 0 && pAVar10 != (Alloc *)0x0) {
          piVar1 = &pAVar10->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar10);
            operator_delete(pAVar10,0x48);
          }
        }
        this_00 = (Alloc *)0x0;
        pAVar10 = (Alloc *)0x0;
      }
      if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
        piVar1 = &this_00->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(this_00);
          operator_delete(this_00,0x48);
        }
      }
      if (((ulong)pAVar10 & 7) == 0 && pAVar10 != (Alloc *)0x0) {
        piVar1 = &pAVar10->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar10);
          operator_delete(pAVar10,0x48);
        }
      }
      local_c8.shared_alloc_.alloc = local_148.shared_alloc_.alloc;
      local_c8.shared_alloc_.direct_ptr = local_148.shared_alloc_.direct_ptr;
      if ((((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
           local_148.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_148.shared_alloc_.alloc)->use_count = (local_148.shared_alloc_.alloc)->use_count + -1
        ;
        local_c8.shared_alloc_.alloc = (Alloc *)((local_148.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_148.shared_alloc_.alloc = (Alloc *)0x0;
      local_148.shared_alloc_.direct_ptr = (void *)0x0;
      Read<signed_char>::Read((Read<signed_char> *)&local_158,&local_c8);
      pAVar10 = local_c8.shared_alloc_.alloc;
      if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
          local_c8.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_c8.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_c8.shared_alloc_.alloc);
          operator_delete(pAVar10,0x48);
        }
      }
      uVar3 = local_190._16_8_;
      if ((local_190._16_8_ & 7) == 0 && (Alloc *)local_190._16_8_ != (Alloc *)0x0) {
        piVar1 = (int *)(local_190._16_8_ + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_190._16_8_);
          operator_delete((void *)uVar3,0x48);
        }
      }
      uVar3 = local_190._0_8_;
      if ((local_190._0_8_ & 7) == 0 && (Alloc *)local_190._0_8_ != (Alloc *)0x0) {
        piVar1 = (int *)(local_190._0_8_ + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_190._0_8_);
          operator_delete((void *)uVar3,0x48);
        }
      }
      pAVar10 = local_148.shared_alloc_.alloc;
      if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
          local_148.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_148.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_148.shared_alloc_.alloc);
          operator_delete(pAVar10,0x48);
        }
      }
      pAVar10 = (marked->write_).shared_alloc_.alloc;
      if (((ulong)pAVar10 & 7) == 0 && pAVar10 != (Alloc *)0x0) {
        piVar1 = &pAVar10->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar10);
          operator_delete(pAVar10,0x48);
        }
      }
      pAVar10 = local_e8;
      (marked->write_).shared_alloc_.alloc = local_158.shared_alloc_.alloc;
      (marked->write_).shared_alloc_.direct_ptr = local_158.shared_alloc_.direct_ptr;
      if ((((ulong)local_158.shared_alloc_.alloc & 7) == 0 &&
           local_158.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_158.shared_alloc_.alloc)->use_count = (local_158.shared_alloc_.alloc)->use_count + -1
        ;
        (marked->write_).shared_alloc_.alloc =
             (Alloc *)((local_158.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_158.shared_alloc_.alloc = (Alloc *)0x0;
      local_158.shared_alloc_.direct_ptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
        piVar1 = &local_e8->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_e8);
          operator_delete(pAVar10,0x48);
        }
      }
      peVar2 = (local_98->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this = (local_98->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_f8 = (local_100->write_).shared_alloc_.alloc;
      if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_f8 = (Alloc *)(local_f8->size * 8 + 1);
        }
        else {
          local_f8->use_count = local_f8->use_count + 1;
        }
      }
      local_f0 = (local_100->write_).shared_alloc_.direct_ptr;
      local_d8 = (marked->write_).shared_alloc_.alloc;
      if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_d8 = (Alloc *)(local_d8->size * 8 + 1);
        }
        else {
          local_d8->use_count = local_d8->use_count + 1;
        }
      }
      local_d0 = (marked->write_).shared_alloc_.direct_ptr;
      if (((ulong)local_f8 & 1) == 0) {
        sVar9 = local_f8->size;
      }
      else {
        sVar9 = (ulong)local_f8 >> 3;
      }
      local_190._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_190._16_8_ = local_190._16_8_ & 0xffffffffffffff00;
      iVar8 = (int)(sVar9 >> 3);
      local_190._0_8_ = (Alloc *)(local_190 + 0x10);
      Write<double>::Write(&local_158,iVar8,(string *)local_190);
      if ((Alloc *)local_190._0_8_ != (Alloc *)(local_190 + 0x10)) {
        operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
      }
      marked = local_40;
      local_c8.shared_alloc_.alloc = local_158.shared_alloc_.alloc;
      if (((ulong)local_158.shared_alloc_.alloc & 7) == 0 &&
          local_158.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_c8.shared_alloc_.alloc = (Alloc *)((local_158.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_158.shared_alloc_.alloc)->use_count =
               (local_158.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_c8.shared_alloc_.direct_ptr = local_158.shared_alloc_.direct_ptr;
      local_b8 = local_d8;
      if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_b8 = (Alloc *)(local_d8->size * 8 + 1);
        }
        else {
          local_d8->use_count = local_d8->use_count + 1;
        }
      }
      local_b0 = local_d0;
      local_a8 = local_f8;
      if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_a8 = (Alloc *)(local_f8->size * 8 + 1);
        }
        else {
          local_f8->use_count = local_f8->use_count + 1;
        }
      }
      local_a0 = local_f0;
      local_148.shared_alloc_.alloc = local_c8.shared_alloc_.alloc;
      if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
          local_c8.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_148.shared_alloc_.alloc = (Alloc *)((local_c8.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_c8.shared_alloc_.alloc)->use_count = (local_c8.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_148.shared_alloc_.direct_ptr = local_158.shared_alloc_.direct_ptr;
      local_138 = local_b8;
      if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_138 = (Alloc *)(local_b8->size * 8 + 1);
        }
        else {
          local_b8->use_count = local_b8->use_count + 1;
        }
      }
      pvStack_130 = local_d0;
      local_128 = local_a8;
      if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128 = (Alloc *)(local_a8->size * 8 + 1);
        }
        else {
          local_a8->use_count = local_a8->use_count + 1;
        }
      }
      pvStack_120 = local_f0;
      if (0 < iVar8) {
        local_190._0_8_ = local_148.shared_alloc_.alloc;
        local_190._8_8_ = local_158.shared_alloc_.direct_ptr;
        if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
            local_148.shared_alloc_.alloc != (Alloc *)0x0) {
          (local_148.shared_alloc_.alloc)->use_count =
               (local_148.shared_alloc_.alloc)->use_count + -1;
          local_190._0_8_ = (local_148.shared_alloc_.alloc)->size * 8 + 1;
        }
        local_148.shared_alloc_.alloc = (Alloc *)0x0;
        local_148.shared_alloc_.direct_ptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_190._16_8_ = local_138;
        local_190._24_8_ = local_d0;
        if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
          local_138->use_count = local_138->use_count + -1;
          local_190._16_8_ = local_138->size * 8 + 1;
        }
        local_138 = (Alloc *)0x0;
        pvStack_130 = (void *)0x0;
        local_170 = local_128;
        local_168 = local_f0;
        if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
          local_128->use_count = local_128->use_count + -1;
          local_170 = (Alloc *)(local_128->size * 8 + 1);
        }
        local_128 = (Alloc *)0x0;
        pvStack_120 = (void *)0x0;
        entering_parallel = '\0';
        lVar6 = 0;
        do {
          ((_func_int ***)local_158.shared_alloc_.direct_ptr)[lVar6] =
               (_func_int **)
               ((double)(int)*(char *)((long)local_d0 + lVar6) *
               *(double *)((long)local_f0 + lVar6 * 8));
          lVar6 = lVar6 + 1;
        } while (iVar8 != (int)lVar6);
        (anonymous_namespace)::
        get_half_weight(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<signed_char>)
        ::$_0::~__0((__0 *)local_190);
      }
      (anonymous_namespace)::
      get_half_weight(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<signed_char>)
      ::$_0::~__0((__0 *)&local_148);
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_88.shared_alloc_.alloc = local_158.shared_alloc_.alloc;
      if (((ulong)local_158.shared_alloc_.alloc & 7) == 0 &&
          local_158.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_88.shared_alloc_.alloc = (Alloc *)((local_158.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_158.shared_alloc_.alloc)->use_count =
               (local_158.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_88.shared_alloc_.direct_ptr = local_158.shared_alloc_.direct_ptr;
      local_190._0_8_ = peVar2;
      local_190._8_8_ = this;
      Read<double>::Read((Read<signed_char> *)&local_148,&local_88);
      local_38 = repro_sum((CommPtr *)local_190,(Reals *)&local_148);
      pAVar10 = local_148.shared_alloc_.alloc;
      if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
          local_148.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_148.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_148.shared_alloc_.alloc);
          operator_delete(pAVar10,0x48);
        }
      }
      pAVar10 = local_88.shared_alloc_.alloc;
      if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
          local_88.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_88.shared_alloc_.alloc);
          operator_delete(pAVar10,0x48);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
      }
      (anonymous_namespace)::
      get_half_weight(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<signed_char>)
      ::$_0::~__0((__0 *)&local_c8);
      pAVar10 = local_158.shared_alloc_.alloc;
      if (((ulong)local_158.shared_alloc_.alloc & 7) == 0 &&
          local_158.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_158.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_158.shared_alloc_.alloc);
          operator_delete(pAVar10,0x48);
        }
      }
      pAVar10 = local_d8;
      if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
        piVar1 = &local_d8->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_d8);
          operator_delete(pAVar10,0x48);
        }
      }
      pAVar10 = local_f8;
      if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
        piVar1 = &local_f8->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_f8);
          operator_delete(pAVar10,0x48);
        }
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (ABS(local_38 - local_160) <= local_90) break;
      dVar15 = (double)local_118._0_8_ +
               (double)(~-(ulong)(local_160 < local_38) & (ulong)-local_78 |
                       -(ulong)(local_160 < local_38) & (ulong)local_78);
      local_191 = uVar7 < 0x33;
      uVar7 = uVar7 + 1;
      if (uVar7 == 0x34) {
        return local_191;
      }
    }
    return local_191;
  }
  fail("assertion %s failed at %s +%d\n","n == masses.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_inertia.cpp"
       ,0x5c);
}

Assistant:

bool mark_axis_bisection(CommPtr comm, Reals distances, Reals masses,
    Real total_mass, Real tolerance, Read<I8>& marked) {
  auto n = distances.size();
  OMEGA_H_CHECK(n == masses.size());
  auto minmax_dist = get_minmax(comm, distances);
  auto range = max2(std::abs(minmax_dist.min), std::abs(minmax_dist.max));
  auto step = range / 2.;
  Real distance = 0.;
  for (Int i = 0; i < MANTISSA_BITS; ++i) {
    marked = mark_half(distances, distance);
    auto half_weight = get_half_weight(comm, masses, marked);
    if (std::abs(half_weight - (total_mass / 2.)) <= tolerance) {
      return true;
    }
    if (half_weight > total_mass / 2.) {
      distance += step;
    } else {
      distance -= step;
    }
    step /= 2.;
  }
  return false;
}